

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

int main(void)

{
  _Bool _Var1;
  char cli_addr [128];
  fnet_address_t addr;
  size_t read_len;
  char buf [65536];
  fnet_socket_t srv;
  fnet_address_t srv_addr;
  fnet_address_t *in_stack_fffffffffffefe58;
  fnet_sock_t in_stack_fffffffffffefe60;
  undefined4 in_stack_fffffffffffefe64;
  undefined4 in_stack_fffffffffffefe68;
  uint in_stack_fffffffffffefe6c;
  fnet_socket_t in_stack_fffffffffffefe70;
  undefined4 in_stack_fffffffffffefe74;
  fnet_address_t *in_stack_fffffffffffefe78;
  fnet_socket_t in_stack_fffffffffffefe80;
  undefined8 uStack_100a0;
  undefined1 auStack_10098 [65552];
  fnet_address_t local_88;
  undefined4 local_4;
  
  local_4 = 0;
  fnet_socket_init();
  fnet_str2addr("127.0.0.1:10500",&local_88);
  fnet_socket_bind(in_stack_fffffffffffefe60,in_stack_fffffffffffefe58);
  uStack_100a0 = 0;
  _Var1 = fnet_socket_recvfrom
                    (in_stack_fffffffffffefe80,(char *)in_stack_fffffffffffefe78,
                     CONCAT44(in_stack_fffffffffffefe74,in_stack_fffffffffffefe70),
                     (size_t *)CONCAT44(in_stack_fffffffffffefe6c,in_stack_fffffffffffefe68),
                     (fnet_address_t *)CONCAT44(in_stack_fffffffffffefe64,in_stack_fffffffffffefe60)
                    );
  if (_Var1) {
    auStack_10098[uStack_100a0 + -1] = 0;
    fnet_addr2str(in_stack_fffffffffffefe78,
                  (char *)CONCAT44(in_stack_fffffffffffefe74,in_stack_fffffffffffefe70),
                  in_stack_fffffffffffefe6c);
    printf("Got: %s, from %s\n",auStack_10098,&stack0xfffffffffffefe58);
    fnet_socket_sendto(in_stack_fffffffffffefe70,
                       (char *)CONCAT44(in_stack_fffffffffffefe6c,in_stack_fffffffffffefe68),
                       CONCAT44(in_stack_fffffffffffefe64,in_stack_fffffffffffefe60),
                       in_stack_fffffffffffefe58);
  }
  fnet_socket_close(0);
  fnet_socket_uninit();
  return 0;
}

Assistant:

int main()
{
    fnet_socket_init();

    fnet_address_t srv_addr;
    fnet_str2addr("127.0.0.1:10500", &srv_addr);
    fnet_socket_t srv = fnet_socket_bind(FNET_SOCK_DGRAM, &srv_addr);

    char buf[65536];
    size_t read_len = 0;
    fnet_address_t addr;
    
    if (fnet_socket_recvfrom(srv, buf, sizeof buf, &read_len, &addr))
    {
        buf[read_len - 1] = 0;
        
        char cli_addr[128];
        fnet_addr2str(&addr, cli_addr, sizeof cli_addr);
        printf("Got: %s, from %s\n", buf, cli_addr);

        fnet_socket_sendto(srv, buf, read_len, &addr);
    }

    fnet_socket_close(srv);
    fnet_socket_uninit();
    return 0;
}